

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

ParseResult __thiscall
xe::TestResultParser::parse(TestResultParser *this,deUint8 *bytes,int numBytes)

{
  Element EVar1;
  ParseResult PVar2;
  TestResultParseError *this_00;
  allocator<char> local_49;
  string local_48;
  
  xml::Parser::feed(&this->m_xmlParser,bytes,numBytes);
  PVar2 = PARSERESULT_NOT_CHANGED;
  while( true ) {
    EVar1 = (this->m_xmlParser).m_element;
    if ((EVar1 & ~ELEMENT_END_OF_STRING) == ELEMENT_INCOMPLETE) break;
    if (EVar1 == ELEMENT_DATA) {
      handleData(this);
    }
    else if (EVar1 == ELEMENT_END) {
      handleElementEnd(this);
    }
    else if (EVar1 == ELEMENT_START) {
      handleElementStart(this);
    }
    xml::Parser::advance(&this->m_xmlParser);
    PVar2 = PARSERESULT_CHANGED;
  }
  if (EVar1 == ELEMENT_END_OF_STRING) {
    if (this->m_state != STATE_TEST_CASE_RESULT_ENDED) {
      this_00 = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Unexpected end of log data",&local_49);
      TestResultParseError::TestResultParseError(this_00,&local_48);
      __cxa_throw(this_00,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    PVar2 = PARSERESULT_COMPLETE;
  }
  return PVar2;
}

Assistant:

TestResultParser::ParseResult TestResultParser::parse (const deUint8* bytes, int numBytes)
{
	DE_ASSERT(m_result && m_state != STATE_NOT_INITIALIZED);

	try
	{
		bool resultChanged = false;

		m_xmlParser.feed(bytes, numBytes);

		for (;;)
		{
			xml::Element curElement = m_xmlParser.getElement();

			if (curElement == xml::ELEMENT_INCOMPLETE	||
				curElement == xml::ELEMENT_END_OF_STRING)
				break;

			switch (curElement)
			{
				case xml::ELEMENT_START:	handleElementStart();		break;
				case xml::ELEMENT_END:		handleElementEnd();			break;
				case xml::ELEMENT_DATA:		handleData();				break;

				default:
					DE_ASSERT(false);
			}

			resultChanged = true;
			m_xmlParser.advance();
		}

		if (m_xmlParser.getElement() == xml::ELEMENT_END_OF_STRING)
		{
			if (m_state != STATE_TEST_CASE_RESULT_ENDED)
				throw TestResultParseError("Unexpected end of log data");

			return PARSERESULT_COMPLETE;
		}
		else
			return resultChanged ? PARSERESULT_CHANGED
								 : PARSERESULT_NOT_CHANGED;
	}
	catch (const TestResultParseError& e)
	{
		// Set error code to result.
		m_result->statusCode	= TESTSTATUSCODE_INTERNAL_ERROR;
		m_result->statusDetails	= e.what();

		return PARSERESULT_ERROR;
	}
	catch (const xml::ParseError& e)
	{
		// Set error code to result.
		m_result->statusCode	= TESTSTATUSCODE_INTERNAL_ERROR;
		m_result->statusDetails	= e.what();

		return PARSERESULT_ERROR;
	}
}